

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrBeginSession(XrSession session,XrSessionBeginInfo *beginInfo)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_2c;
  LoaderInstance *pLStack_28;
  XrResult result;
  LoaderInstance *loader_instance;
  XrSessionBeginInfo *beginInfo_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)beginInfo;
  beginInfo_local = (XrSessionBeginInfo *)session;
  local_2c = ActiveLoaderInstance::Get(&stack0xffffffffffffffd8,"xrBeginSession");
  if (XR_ERROR_VALIDATION_FAILURE < local_2c) {
    this = LoaderInstance::DispatchTable(pLStack_28);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_2c = (*pXVar1->BeginSession)
                         ((XrSession)beginInfo_local,(XrSessionBeginInfo *)loader_instance);
  }
  return local_2c;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrBeginSession(
    XrSession                                   session,
    const XrSessionBeginInfo*                   beginInfo) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrBeginSession");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->BeginSession(session, beginInfo);
    }
    return result;
}